

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.h
# Opt level: O0

int spvtools::assumedBitWidth(IdType *type)

{
  IdType *type_local;
  
  if (type->type_class == kBottom) {
    type_local._4_4_ = 0x20;
  }
  else if (type->type_class - kScalarIntegerType < 2) {
    type_local._4_4_ = type->bitwidth;
  }
  else {
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

inline int assumedBitWidth(const IdType& type) {
  switch (type.type_class) {
    case IdTypeClass::kBottom:
      return 32;
    case IdTypeClass::kScalarIntegerType:
    case IdTypeClass::kScalarFloatType:
      return type.bitwidth;
    default:
      break;
  }
  // We don't care about this case.
  return 0;
}